

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orang.h
# Opt level: O0

void __thiscall Orang::Orang(Orang *this)

{
  Point<double> local_548;
  Point<double> local_530;
  Point<double> local_518;
  Point<double> local_500;
  Point<double> local_4e8;
  Point<double> local_4d0;
  Point<double> local_4b8;
  Point<double> local_4a0;
  Point<double> local_488;
  Point<double> local_470;
  Point<double> local_458;
  Point<double> local_440;
  Point<double> local_428;
  Point<double> local_410;
  Point<double> local_3f8;
  Point<double> local_3e0;
  Point<double> local_3c8;
  Point<double> local_3b0;
  Point<double> local_398;
  Point<double> local_380;
  Point<double> local_368;
  Point<double> local_350;
  Point<double> local_338;
  Point<double> local_320;
  Point<double> local_308;
  Point<double> local_2f0;
  Point<double> local_2d8;
  Point<double> local_2c0;
  Point<double> local_2a8;
  Point<double> local_290;
  Point<double> local_278;
  Point<double> local_260;
  Point<double> local_248;
  Point<double> local_230;
  Point<double> local_218;
  Point<double> local_200;
  Point<double> local_1e8;
  Point<double> local_1d0;
  Point<double> local_1b8;
  Point<double> local_1a0;
  Point<double> local_188;
  Point<double> local_170;
  Point<double> local_158;
  Point<double> local_140;
  Point<double> local_128;
  Point<double> local_110;
  Point<double> local_f8;
  Point<double> local_e0;
  Point<double> local_c8;
  Point<double> local_b0;
  Point<double> local_98;
  Point<double> local_80;
  Point<double> local_68;
  Point<double> local_50;
  Point<double> local_28;
  Orang *local_10;
  Orang *this_local;
  
  local_10 = this;
  Polygon::Polygon(&this->super_Polygon);
  Point<double>::Point(&local_28,412.0,300.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_50,420.0,300.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_68,420.0,308.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_80,428.0,308.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_98,428.0,316.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_b0,437.0,316.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_c8,437.0,358.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_e0,429.0,358.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_f8,429.0,366.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_110,421.0,366.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_128,421.0,375.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_140,454.0,375.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_158,454.0,385.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_170,462.0,385.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_188,462.0,467.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_1a0,464.0,467.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_1b8,464.0,490.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_1d0,443.0,490.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_1e8,443.0,467.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_200,445.0,467.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_218,445.0,400.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_230,437.0,400.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_248,437.0,590.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_260,445.0,590.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_278,445.0,600.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_290,410.0,600.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_2a8,410.0,520.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_2c0,400.0,510.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_2d8,390.0,520.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_2f0,390.0,600.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_308,355.0,600.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_320,355.0,590.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_338,363.0,590.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_350,363.0,400.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_368,355.0,400.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_380,355.0,467.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_398,357.0,467.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_3b0,357.0,490.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_3c8,336.0,490.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_3e0,336.0,467.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_3f8,338.0,467.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_410,338.0,385.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_428,346.0,385.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_440,346.0,375.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_458,392.0,375.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_470,374.0,375.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_488,374.0,366.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_4a0,366.0,366.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_4b8,366.0,358.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_4d0,358.0,358.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_4e8,358.0,316.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_500,366.0,316.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_518,366.0,308.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_530,374.0,308.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_548,374.0,300.0,0.0);
  Polygon::addPoint((Point *)this);
  return;
}

Assistant:

Orang() {
    addPoint(Point<double>(412,300));
    addPoint(Point<double>(420,300));
    addPoint(Point<double>(420,308));
    addPoint(Point<double>(428,308));
    addPoint(Point<double>(428,316));
    addPoint(Point<double>(437,316));
    addPoint(Point<double>(437,358));
    addPoint(Point<double>(429,358));
    addPoint(Point<double>(429,366));
    addPoint(Point<double>(421,366));
    addPoint(Point<double>(421,375));
    addPoint(Point<double>(454,375));
    addPoint(Point<double>(454,385));
    addPoint(Point<double>(462,385));
    addPoint(Point<double>(462,467));
    addPoint(Point<double>(464,467));
    addPoint(Point<double>(464,490));
    addPoint(Point<double>(443,490));
    addPoint(Point<double>(443,467));
    addPoint(Point<double>(445,467));
    addPoint(Point<double>(445,400));
    addPoint(Point<double>(437,400));
    addPoint(Point<double>(437,590));
    addPoint(Point<double>(445,590));
    addPoint(Point<double>(445,600));
    addPoint(Point<double>(410,600));
    addPoint(Point<double>(410,520));
    addPoint(Point<double>(400,510));
    addPoint(Point<double>(390,520));
    addPoint(Point<double>(390,600));
    addPoint(Point<double>(355,600));
    addPoint(Point<double>(355,590));
    addPoint(Point<double>(363,590));
    addPoint(Point<double>(363,400));
    addPoint(Point<double>(355,400));
    addPoint(Point<double>(355,467));
    addPoint(Point<double>(357,467));
    addPoint(Point<double>(357,490));
    addPoint(Point<double>(336,490));
    addPoint(Point<double>(336,467));
    addPoint(Point<double>(338,467));
    addPoint(Point<double>(338,385));
    addPoint(Point<double>(346,385));
    addPoint(Point<double>(346,375));
    addPoint(Point<double>(392,375));
    addPoint(Point<double>(374,375));
    addPoint(Point<double>(374,366));
    addPoint(Point<double>(366,366));
    addPoint(Point<double>(366,358));
    addPoint(Point<double>(358,358));
    addPoint(Point<double>(358,316));
    addPoint(Point<double>(366,316));
    addPoint(Point<double>(366,308));
    addPoint(Point<double>(374,308));
    addPoint(Point<double>(374,300));
  }